

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XSDDOMParser::docComment(XSDDOMParser *this,XMLCh *comment)

{
  XMLBuffer *this_00;
  
  if (-1 < this->fAnnotationDepth) {
    this_00 = &this->fAnnotationBuf;
    XMLBuffer::append(this_00,(XMLCh *)XMLUni::fgCommentString);
    XMLBuffer::append(this_00,comment);
    XMLBuffer::append(this_00,L'-');
    XMLBuffer::append(this_00,L'-');
    XMLBuffer::append(this_00,L'>');
    return;
  }
  return;
}

Assistant:

void XSDDOMParser::docComment(const XMLCh* const comment)
{
    if (fAnnotationDepth > -1)
    {
        fAnnotationBuf.append(XMLUni::fgCommentString);
        fAnnotationBuf.append(comment);
        fAnnotationBuf.append(chDash);
        fAnnotationBuf.append(chDash);
        fAnnotationBuf.append(chCloseAngle);
    }
}